

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall
CVmObjStringBuffer::compare_to(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  char *str;
  long lVar8;
  int iVar9;
  int iVar10;
  
  if (val->typ == VM_OBJ) {
    iVar7 = is_string_buffer_obj((val->val).obj);
    if (iVar7 != 0) {
      piVar4 = (int *)(this->super_CVmObject).ext_;
      iVar7 = *piVar4;
      piVar5 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                                ptr_ + 8);
      iVar1 = *piVar5;
      iVar6 = iVar1;
      if (iVar7 < iVar1) {
        iVar6 = iVar7;
      }
      lVar8 = 0;
      iVar10 = 0;
      if (0 < iVar6) {
        iVar10 = iVar6;
      }
      iVar9 = -1;
      do {
        if (iVar10 == (int)lVar8) {
LAB_002a226d:
          iVar7 = iVar7 - iVar1;
          if ((int)lVar8 < iVar6) {
            iVar7 = iVar9;
          }
          return iVar7;
        }
        iVar2 = piVar5[lVar8 + 3];
        iVar3 = piVar4[lVar8 + 3];
        if (iVar3 < iVar2) goto LAB_002a226d;
        if (iVar2 < iVar3) {
          iVar9 = 1;
          goto LAB_002a226d;
        }
        lVar8 = lVar8 + 1;
      } while( true );
    }
  }
  str = vm_val_t::get_as_string(val);
  if (str != (char *)0x0) {
    iVar7 = compare_str(this,str);
    return iVar7;
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjStringBuffer::compare_to(VMG_ vm_obj_id_t self,
                                   const vm_val_t *val) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;
        for (int32_t i = 0 ; i < len1 && i < len2 ; ++i, ++buf1, ++buf2)
        {
            if (*buf1 < *buf2)
                return -1;
            else if (*buf1 > *buf2)
                return 1;
        }

        /* 
         *   They're equal up to the full length of the shorter string.  If
         *   we ran out of strings at the same time, they're equal; otherwise
         *   the longer string compares greater 
         */
        return len1 - len2;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return compare_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}